

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::KillSymToValueMapForGeneratorYield(GlobOptBlockData *this)

{
  code *pcVar1;
  GlobHashBucket *this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *pTVar4;
  ValueInfo *pVVar5;
  Sym *pSVar6;
  StackSym *pSVar7;
  Sym *symStore_1;
  Value *value;
  GlobHashBucket *bucket_1;
  EditingIterator iter;
  uint _iterHash_1;
  Sym *sym;
  Sym *symStore;
  GlobHashBucket *bucket;
  Iterator __iter;
  uint _iterHash;
  GlobOptBlockData *this_local;
  
  __iter.current._4_4_ = 0;
LAB_005f5711:
  if (this->symToValueMap->tableSize <= __iter.current._4_4_) {
    iter.last._4_4_ = 0;
    do {
      if (this->symToValueMap->tableSize <= iter.last._4_4_) {
        return;
      }
      SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&bucket_1,this->symToValueMap->table + iter.last._4_4_);
LAB_005f594c:
      while (bVar2 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)&bucket_1), bVar2) {
        pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&bucket_1);
        if (pTVar4->element != (Value *)0x0) {
          pVVar5 = ::Value::GetValueInfo(pTVar4->element);
          pSVar6 = ValueInfo::GetSymStore(pVVar5);
          if ((pSVar6 != (Sym *)0x0) && (bVar2 = Sym::IsStackSym(pSVar6), bVar2)) goto LAB_005f59c0;
          goto LAB_005f59d5;
        }
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)&bucket_1,&this->symToValueMap->alloc->super_ArenaAllocator
                     );
      }
      iter.last._4_4_ = iter.last._4_4_ + 1;
    } while( true );
  }
  _bucket = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                      (this->symToValueMap->table + __iter.current._4_4_);
LAB_005f574c:
  do {
    if (__iter.list ==
        (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = bucket;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       this_00,node);
    if (bVar2) goto LAB_005f5900;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)&bucket);
    if (pTVar4->element != (Value *)0x0) {
      pVVar5 = ::Value::GetValueInfo(pTVar4->element);
      pSVar6 = ValueInfo::GetSymStore(pVVar5);
      if ((pSVar6 != (Sym *)0x0) && (bVar2 = Sym::IsStackSym(pSVar6), bVar2)) {
        pSVar7 = Sym::AsStackSym(pSVar6);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar7);
        if (bVar2) goto LAB_005f574c;
      }
      pSVar6 = pTVar4->value;
      if ((pSVar6 != (Sym *)0x0) && (bVar2 = Sym::IsStackSym(pSVar6), bVar2)) {
        pSVar7 = Sym::AsStackSym(pSVar6);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar7);
        if (bVar2) {
          pVVar5 = ::Value::GetValueInfo(pTVar4->element);
          ValueInfo::SetSymStore(pVVar5,pSVar6);
        }
      }
    }
  } while( true );
LAB_005f59c0:
  pSVar7 = Sym::AsStackSym(pSVar6);
  bVar2 = StackSym::HasByteCodeRegSlot(pSVar7);
  if (!bVar2) {
LAB_005f59d5:
    SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
    RemoveCurrent((EditingIterator *)&bucket_1,&this->symToValueMap->alloc->super_ArenaAllocator);
  }
  goto LAB_005f594c;
LAB_005f5900:
  __iter.current._4_4_ = __iter.current._4_4_ + 1;
  goto LAB_005f5711;
}

Assistant:

void
GlobOptBlockData::KillSymToValueMapForGeneratorYield()
{
    // Remove illegal symToValueMap entries whose symstores don't have bytecode registers
    // Hash table bucket key-value visualization: { bucket.value: bucket.element }
    //
    // Idea:
    // Multiple symbols can map to the same value which has a symstore
    // (multiple keys map to same value).
    // Since the symstore might not have a bytecode register, our first pass
    // through the map attemps to use the symbol (key) as a symstore for that value.
    // This allows us to still retain such entries.
    // After the first pass, any symToValueMap entries whose symstores don't have
    // bytecode registers will be cleared.
    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, this->symToValueMap)
    {
        if (bucket.element == nullptr)
        {
            continue;
        }

        Sym* symStore = bucket.element->GetValueInfo()->GetSymStore();
        if (symStore != nullptr && symStore->IsStackSym() && symStore->AsStackSym()->HasByteCodeRegSlot())
        {
            continue;
        }

        Sym* sym = bucket.value;
        if (sym != nullptr && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
        {
            bucket.element->GetValueInfo()->SetSymStore(sym);
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    // Remove illegal entries
    FOREACH_VALUEHASHTABLE_ENTRY_EDITING(GlobHashBucket, bucket, this->symToValueMap, iter)
    {
        Value* value = bucket.element;
        if (value == nullptr)
        {
            iter.RemoveCurrent(this->symToValueMap->alloc);
        }
        else
        {
            Sym* symStore = value->GetValueInfo()->GetSymStore();
            if (symStore == nullptr || !symStore->IsStackSym() || !symStore->AsStackSym()->HasByteCodeRegSlot())
            {
                iter.RemoveCurrent(this->symToValueMap->alloc);
            }
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY_EDITING;
}